

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  ma_uint32 mVar3;
  uint uVar4;
  ma_uint64 mVar5;
  ulong uVar6;
  uint shift;
  int iVar7;
  ma_int16 *pmVar8;
  size_t sVar9;
  ulong uVar10;
  ma_int32 *pmVar11;
  ulong uVar12;
  ulong uVar13;
  uint j;
  long lVar14;
  bool bVar15;
  ma_uint64 totalFramesRead;
  ma_int16 samples16 [2048];
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) {
LAB_00149f62:
    totalFramesRead = 0;
  }
  else {
    if (pBufferOut == (ma_int32 *)0x0) {
      mVar5 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
      return mVar5;
    }
    totalFramesRead = 0;
    switch(pWav->translatedFormatTag) {
    case 1:
      memset(samples16,0,0x1000);
      if (pWav->bitsPerSample == 0x20) {
        mVar5 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
        return mVar5;
      }
      mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar3 != 0) {
        uVar1 = pWav->channels;
        uVar6 = (ulong)mVar3 / (ulong)uVar1;
        if (mVar3 < uVar1) {
          return 0;
        }
        if (mVar3 % (uint)uVar1 != 0) {
          return 0;
        }
        uVar2 = (uint)uVar6;
        totalFramesRead = 0;
        while( true ) {
          if (framesToRead == 0) {
            return totalFramesRead;
          }
          uVar10 = 0x1000 / (ulong)mVar3;
          if (framesToRead < 0x1000 / (ulong)mVar3) {
            uVar10 = framesToRead;
          }
          mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar10,samples16);
          if (mVar5 == 0) break;
          uVar10 = pWav->channels * mVar5;
          if (0x1000 < uVar10 * uVar6) {
            return totalFramesRead;
          }
          switch(uVar2) {
          case 1:
            ma_dr_wav_u8_to_s32(pBufferOut,(ma_uint8 *)samples16,uVar10);
            break;
          case 2:
            ma_dr_wav_s16_to_s32(pBufferOut,samples16,uVar10);
            break;
          case 3:
            ma_dr_wav_s24_to_s32(pBufferOut,(ma_uint8 *)samples16,uVar10);
            break;
          case 4:
            for (uVar13 = 0; uVar12 = uVar13 & 0xffffffff, uVar12 <= uVar10 && uVar10 - uVar12 != 0;
                uVar13 = uVar13 + 1) {
              pBufferOut[uVar13] = *(ma_int32 *)(samples16 + uVar12 * 2);
            }
            break;
          default:
            if (uVar2 < 9) {
              pmVar8 = samples16;
              pmVar11 = pBufferOut;
              for (uVar4 = 0; uVar4 <= uVar10 && uVar10 - uVar4 != 0; uVar4 = uVar4 + 1) {
                lVar14 = 0;
                uVar12 = 0;
                uVar13 = uVar6;
                iVar7 = uVar2 * -8 + 0x40;
                while (bVar15 = uVar13 != 0, uVar13 = uVar13 - 1, bVar15) {
                  uVar12 = uVar12 | (ulong)*(byte *)((long)pmVar8 + lVar14) << ((byte)iVar7 & 0x3f);
                  iVar7 = iVar7 + 8;
                  lVar14 = lVar14 + 1;
                }
                pmVar8 = (ma_int16 *)((long)pmVar8 + uVar6);
                *pmVar11 = (ma_int32)(uVar12 >> 0x20);
                pmVar11 = pmVar11 + 1;
              }
            }
            else {
              memset(pBufferOut,0,uVar10 * 4);
            }
          }
          pBufferOut = pBufferOut + uVar10;
          framesToRead = framesToRead - mVar5;
          totalFramesRead = totalFramesRead + mVar5;
        }
        return totalFramesRead;
      }
      goto LAB_00149f62;
    case 3:
      totalFramesRead = 0;
      memset(samples16,0,0x1000);
      mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar3 != 0) {
        uVar1 = pWav->channels;
        totalFramesRead = 0;
        if ((uVar1 <= mVar3) && (mVar3 % (uint)uVar1 == 0)) {
          iVar7 = (int)((ulong)mVar3 / (ulong)uVar1);
          totalFramesRead = 0;
          for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
            uVar6 = 0x1000 / (ulong)mVar3;
            if (framesToRead < 0x1000 / (ulong)mVar3) {
              uVar6 = framesToRead;
            }
            mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar6,samples16);
            if (mVar5 == 0) {
              return totalFramesRead;
            }
            sVar9 = pWav->channels * mVar5;
            if (0x1000 < sVar9 * ((ulong)mVar3 / (ulong)uVar1)) {
              return totalFramesRead;
            }
            if (iVar7 == 8) {
              ma_dr_wav_f64_to_s32(pBufferOut,(double *)samples16,sVar9);
            }
            else if (iVar7 == 4) {
              ma_dr_wav_f32_to_s32(pBufferOut,(float *)samples16,sVar9);
            }
            else {
              memset(pBufferOut,0,sVar9 * 4);
            }
            pBufferOut = pBufferOut + sVar9;
            totalFramesRead = totalFramesRead + mVar5;
          }
        }
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      totalFramesRead = 0;
      memset(samples16,0,0x1000);
      mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar3 != 0) {
        uVar1 = pWav->channels;
        totalFramesRead = 0;
        if ((uVar1 <= mVar3) && (mVar3 % (uint)uVar1 == 0)) {
          totalFramesRead = 0;
          for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
            uVar6 = 0x1000 / (ulong)mVar3;
            if (framesToRead < 0x1000 / (ulong)mVar3) {
              uVar6 = framesToRead;
            }
            mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar6,samples16);
            if (mVar5 == 0) {
              return totalFramesRead;
            }
            sVar9 = pWav->channels * mVar5;
            if (0x1000 < sVar9 * ((ulong)mVar3 / (ulong)uVar1)) {
              return totalFramesRead;
            }
            ma_dr_wav_alaw_to_s32(pBufferOut,(ma_uint8 *)samples16,sVar9);
            pBufferOut = pBufferOut + sVar9;
            totalFramesRead = totalFramesRead + mVar5;
          }
        }
      }
      break;
    case 7:
      totalFramesRead = 0;
      memset(samples16,0,0x1000);
      mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
      if (mVar3 != 0) {
        uVar1 = pWav->channels;
        totalFramesRead = 0;
        if ((uVar1 <= mVar3) && (mVar3 % (uint)uVar1 == 0)) {
          totalFramesRead = 0;
          for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
            uVar6 = 0x1000 / (ulong)mVar3;
            if (framesToRead < 0x1000 / (ulong)mVar3) {
              uVar6 = framesToRead;
            }
            mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar6,samples16);
            if (mVar5 == 0) {
              return totalFramesRead;
            }
            sVar9 = pWav->channels * mVar5;
            if (0x1000 < sVar9 * ((ulong)mVar3 / (ulong)uVar1)) {
              return totalFramesRead;
            }
            ma_dr_wav_mulaw_to_s32(pBufferOut,(ma_uint8 *)samples16,sVar9);
            pBufferOut = pBufferOut + sVar9;
            totalFramesRead = totalFramesRead + mVar5;
          }
        }
      }
      break;
    default:
      if (pWav->translatedFormatTag != 0x11) {
        return 0;
      }
    case 2:
      totalFramesRead = 0;
      for (; framesToRead != 0; framesToRead = framesToRead - mVar5) {
        uVar6 = (ulong)(0x800 / pWav->channels);
        if (framesToRead < uVar6) {
          uVar6 = framesToRead;
        }
        mVar5 = ma_dr_wav_read_pcm_frames_s16(pWav,uVar6,samples16);
        if (mVar5 == 0) {
          return totalFramesRead;
        }
        ma_dr_wav_s16_to_s32(pBufferOut,samples16,pWav->channels * mVar5);
        pBufferOut = pBufferOut + pWav->channels * mVar5;
        totalFramesRead = totalFramesRead + mVar5;
      }
    }
  }
  return totalFramesRead;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int32* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int32) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int32) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s32__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s32__msadpcm_ima(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s32__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s32__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s32__mulaw(pWav, framesToRead, pBufferOut);
    }
    return 0;
}